

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cpp
# Opt level: O1

deque<EOPlus::Scope,_std::allocator<EOPlus::Scope>_> * __thiscall
EOPlus::Parser::ParseScopes
          (deque<EOPlus::Scope,_std::allocator<EOPlus::Scope>_> *__return_storage_ptr__,Parser *this
          )

{
  Parser_Token_Server_Base *pPVar1;
  bool bVar2;
  int iVar3;
  const_iterator cVar4;
  undefined8 extraout_RAX;
  runtime_error *this_00;
  long *plVar5;
  size_type *psVar6;
  Token *t_00;
  long lVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  int iVar9;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EOPlus::Scope::Type>_>
  __l;
  Token t;
  Scope s;
  allocator_type local_2b9;
  deque<EOPlus::Scope,_std::allocator<EOPlus::Scope>_> *local_2b8;
  ulong local_2b0;
  undefined1 local_2a8 [24];
  _Alloc_hider local_290;
  size_type local_288;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_280;
  bool local_270;
  bool bStack_26f;
  bool bStack_26e;
  bool bStack_26d;
  bool bStack_26c;
  undefined3 uStack_26b;
  var_type local_268;
  int local_260;
  _Any_data local_258;
  code *local_248;
  code *local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  undefined1 *local_210 [2];
  undefined1 local_200 [16];
  undefined1 local_1f0 [24];
  _Alloc_hider local_1d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  bool local_1b8;
  bool bStack_1b7;
  bool bStack_1b6;
  bool bStack_1b5;
  bool bStack_1b4;
  undefined3 uStack_1b3;
  var_type local_1b0;
  int local_1a8;
  string local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  undefined1 local_160 [32];
  _Elt_pointer pvStack_140;
  undefined1 local_138 [40];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EOPlus::Scope::Type>
  pStack_110;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EOPlus::Scope::Type>
  local_e8;
  variant local_c0;
  Token local_80;
  
  if ((ParseScopes()::scope_id_map_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&ParseScopes()::scope_id_map_abi_cxx11_), iVar3 != 0)) {
    local_2a8._0_4_ = Character;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EOPlus::Scope::Type>
    ::pair<const_char_(&)[10],_EOPlus::Scope::Type,_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EOPlus::Scope::Type>
                *)local_160,(char (*) [10])"character",(Type *)local_2a8);
    local_180._M_dataplus._M_p._0_4_ = 2;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EOPlus::Scope::Type>
    ::pair<const_char_(&)[4],_EOPlus::Scope::Type,_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EOPlus::Scope::Type>
                *)local_138,(char (*) [4])0x1a759d,(Type *)&local_180);
    local_230._M_dataplus._M_p._0_4_ = 3;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EOPlus::Scope::Type>
    ::pair<const_char_(&)[4],_EOPlus::Scope::Type,_true>
              (&pStack_110,(char (*) [4])0x1a5898,(Type *)&local_230);
    local_210[0] = (undefined1 *)CONCAT44(local_210[0]._4_4_,4);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EOPlus::Scope::Type>
    ::pair<const_char_(&)[6],_EOPlus::Scope::Type,_true>
              (&local_e8,(char (*) [6])0x1a9343,(Type *)local_210);
    __l._M_len = 4;
    __l._M_array = (iterator)local_160;
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EOPlus::Scope::Type,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EOPlus::Scope::Type>_>_>
    ::map(&ParseScopes()::scope_id_map_abi_cxx11_,__l,
          (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
          &local_1a0,&local_2b9);
    lVar7 = -0xa0;
    paVar8 = &local_e8.first.field_2;
    do {
      if (paVar8 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(&paVar8->_M_allocated_capacity)[-2]) {
        operator_delete((long *)(&paVar8->_M_allocated_capacity)[-2],
                        paVar8->_M_allocated_capacity + 1);
      }
      paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(&paVar8->_M_allocated_capacity + -5);
      lVar7 = lVar7 + 0x28;
    } while (lVar7 != 0);
    __cxa_atexit(std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EOPlus::Scope::Type,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EOPlus::Scope::Type>_>_>
                 ::~map,&ParseScopes()::scope_id_map_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&ParseScopes()::scope_id_map_abi_cxx11_);
  }
  (__return_storage_ptr__->super__Deque_base<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>)._M_impl
  .super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (__return_storage_ptr__->super__Deque_base<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>)._M_impl
  .super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  (__return_storage_ptr__->super__Deque_base<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>)._M_impl
  .super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (__return_storage_ptr__->super__Deque_base<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>)._M_impl
  .super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (__return_storage_ptr__->super__Deque_base<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>)._M_impl
  .super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (__return_storage_ptr__->super__Deque_base<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>)._M_impl
  .super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (__return_storage_ptr__->super__Deque_base<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>)._M_impl
  .super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (__return_storage_ptr__->super__Deque_base<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>)._M_impl
  .super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (__return_storage_ptr__->super__Deque_base<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>)._M_impl
  .super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (__return_storage_ptr__->super__Deque_base<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>)._M_impl
  .super__Deque_impl_data._M_map_size = 0;
  local_2b8 = __return_storage_ptr__;
  std::_Deque_base<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>::_M_initialize_map
            (&__return_storage_ptr__->
              super__Deque_base<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>,0);
  util::variant::variant(&local_c0);
  local_2a8._0_4_ = Default;
  local_2a8._8_4_ = local_c0.val_int;
  local_2a8._12_4_ = local_c0._4_4_;
  local_2a8._16_4_ = local_c0.val_float._0_4_;
  local_2a8._20_4_ = local_c0.val_float._4_4_;
  local_290._M_p = (pointer)&local_280;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_290,local_c0.val_string._M_dataplus._M_p,
             local_c0.val_string._M_dataplus._M_p + local_c0.val_string._M_string_length);
  local_268 = local_c0.type;
  local_270 = local_c0.val_bool;
  bStack_26f = local_c0.cache_val[0];
  bStack_26e = local_c0.cache_val[1];
  bStack_26d = local_c0.cache_val[2];
  bStack_26c = local_c0.cache_val[3];
  uStack_26b = local_c0._53_3_;
  local_260 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0.val_string._M_dataplus._M_p != &local_c0.val_string.field_2) {
    operator_delete(local_c0.val_string._M_dataplus._M_p,
                    local_c0.val_string.field_2._M_allocated_capacity + 1);
  }
  local_2b0 = 0;
  do {
    bVar2 = GetToken(this,(Token *)local_2a8,1);
    if (!bVar2) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290._M_p == &local_280) {
        return local_2b8;
      }
      operator_delete(local_290._M_p,local_280._M_allocated_capacity + 1);
      return local_2b8;
    }
    util::variant::GetString_abi_cxx11_((string *)local_160,(variant *)(local_2a8 + 8));
    cVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EOPlus::Scope::Type>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EOPlus::Scope::Type>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EOPlus::Scope::Type>_>_>
            ::find(&ParseScopes()::scope_id_map_abi_cxx11_._M_t,(key_type *)local_160);
    if ((undefined1 *)CONCAT44(local_160._4_4_,local_160._0_4_) != local_160 + 0x10) {
      operator_delete((undefined1 *)CONCAT44(local_160._4_4_,local_160._0_4_),local_160._16_8_ + 1);
    }
    if ((_Rb_tree_header *)cVar4._M_node ==
        &ParseScopes()::scope_id_map_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
      pPVar1 = (this->tok)._M_t.
               super___uniq_ptr_impl<EOPlus::Parser_Token_Server_Base,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
               ._M_t.
               super__Tuple_impl<0UL,_EOPlus::Parser_Token_Server_Base_*,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
               .super__Head_base<0UL,_EOPlus::Parser_Token_Server_Base_*,_false>._M_head_impl;
      local_1f0._0_4_ = local_2a8._0_4_;
      local_1f0._8_4_ = local_2a8._8_4_;
      local_1f0._12_4_ = local_2a8._12_4_;
      local_1f0._16_4_ = local_2a8._16_4_;
      local_1f0._20_4_ = local_2a8._20_4_;
      local_1d8._M_p = (pointer)&local_1c8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1d8,local_290._M_p,local_290._M_p + local_288);
      local_1b0 = local_268;
      local_1b8 = local_270;
      bStack_1b7 = bStack_26f;
      bStack_1b6 = bStack_26e;
      bStack_1b5 = bStack_26d;
      bStack_1b4 = bStack_26c;
      uStack_1b3 = uStack_26b;
      local_1a8 = local_260;
      Parser_Token_Server_Base::PutBack(pPVar1,(Token *)local_1f0);
      local_2b0 = CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_p != &local_1c8) {
        operator_delete(local_1d8._M_p,local_1c8._M_allocated_capacity + 1);
      }
    }
    else {
      local_160._0_4_ = Default;
      local_138._32_8_ = (_Elt_pointer)0x0;
      pStack_110.first._M_dataplus._M_p = (pointer)0x0;
      local_138._16_8_ = (_Elt_pointer)0x0;
      local_138._24_8_ = (_Elt_pointer)0x0;
      local_138._0_8_ = (_Elt_pointer)0x0;
      local_138._8_8_ = (_Map_pointer)0x0;
      local_160._24_8_ = (_Elt_pointer)0x0;
      pvStack_140 = (_Elt_pointer)0x0;
      local_160._8_8_ = (_Map_pointer)0x0;
      local_160._16_8_ = 0;
      std::_Deque_base<util::variant,_std::allocator<util::variant>_>::_M_initialize_map
                ((_Deque_base<util::variant,_std::allocator<util::variant>_> *)(local_160 + 8),0);
      local_160._0_4_ = cVar4._M_node[2]._M_color;
      std::deque<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>::push_back
                (local_2b8,(value_type *)local_160);
      local_258._M_unused._M_object = (void *)0x0;
      local_258._8_8_ = 0;
      local_240 = std::
                  _Function_handler<bool_(const_EOPlus::Token_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/eoserv[P]eoserv/src/eoplus/parse.cpp:194:29)>
                  ::_M_invoke;
      local_248 = std::
                  _Function_handler<bool_(const_EOPlus::Token_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/eoserv[P]eoserv/src/eoplus/parse.cpp:194:29)>
                  ::_M_manager;
      bVar2 = GetTokenIf(this,(Token *)local_2a8,
                         (function<bool_(const_EOPlus::Token_&)> *)&local_258,0x40);
      if (local_248 != (code *)0x0) {
        (*local_248)(&local_258,&local_258,__destroy_functor);
      }
      if (!bVar2) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x18);
        local_210[0] = local_200;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_210,"Expected \'.\' after scope-identifier.","");
        plVar5 = (long *)std::__cxx11::string::append((char *)local_210);
        local_230._M_dataplus._M_p = (pointer)*plVar5;
        psVar6 = (size_type *)(plVar5 + 2);
        if ((size_type *)local_230._M_dataplus._M_p == psVar6) {
          local_230.field_2._M_allocated_capacity = *psVar6;
          local_230.field_2._8_8_ = plVar5[3];
          local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
        }
        else {
          local_230.field_2._M_allocated_capacity = *psVar6;
        }
        local_230._M_string_length = plVar5[1];
        *plVar5 = (long)psVar6;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        Parser_Token_Server_Base::RejectToken
                  (&local_80,
                   (this->tok)._M_t.
                   super___uniq_ptr_impl<EOPlus::Parser_Token_Server_Base,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_EOPlus::Parser_Token_Server_Base_*,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
                   .super__Head_base<0UL,_EOPlus::Parser_Token_Server_Base_*,_false>._M_head_impl);
        token_got_string_abi_cxx11_(&local_1a0,(EOPlus *)&local_80,t_00);
        std::operator+(&local_180,&local_230,&local_1a0);
        pPVar1 = (this->tok)._M_t.
                 super___uniq_ptr_impl<EOPlus::Parser_Token_Server_Base,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_EOPlus::Parser_Token_Server_Base_*,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
                 .super__Head_base<0UL,_EOPlus::Parser_Token_Server_Base_*,_false>._M_head_impl;
        iVar3 = pPVar1->line;
        iVar9 = pPVar1->reject_line;
        std::runtime_error::runtime_error(this_00,(string *)&local_180);
        if (iVar9 < iVar3) {
          iVar9 = iVar3;
        }
        *(int *)(this_00 + 0x10) = iVar9;
        *(undefined ***)this_00 = &PTR__runtime_error_001d37c8;
        __cxa_throw(this_00,&Parser_Error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::deque<util::variant,_std::allocator<util::variant>_>::~deque
                ((deque<util::variant,_std::allocator<util::variant>_> *)(local_160 + 8));
    }
    if ((_Rb_tree_header *)cVar4._M_node ==
        &ParseScopes()::scope_id_map_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290._M_p != &local_280) {
        operator_delete(local_290._M_p,local_280._M_allocated_capacity + 1);
      }
      if ((local_2b0 & 1) == 0) {
        std::deque<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>::~deque(local_2b8);
      }
      return local_2b8;
    }
  } while( true );
}

Assistant:

std::deque<Scope> Parser::ParseScopes()
	{
		static const std::map<std::string, Scope::Type> scope_id_map{
			{"character", Scope::Character},
			{"npc", Scope::NPC},
			{"map", Scope::Map},
			{"world", Scope::World}
		};

		std::deque<Scope> scopes;
		Token t;

		while (this->GetToken(t, Token::Identifier))
		{
			auto it = scope_id_map.find(std::string(t.data));

			if (it == scope_id_map.end())
			{
				this->tok->PutBack(t);
				return scopes;
			}

			Scope s;
			s.type = it->second;

			scopes.push_back(s);

			if (!this->GetTokenIf(t, [](const Token& t) { return std::string(t.data) == "."; }, Token::Symbol))
				PARSER_ERROR_GOT("Expected '.' after scope-identifier.");
		}

		return scopes;
	}